

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdPrint_rec(FILE *pFile,Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if ((uint)Id < (uint)pNtk->nNodes + (uint)uVar1) {
      if ((uint)Id < (uint)uVar1) {
        iVar5 = Id + 0x61;
      }
      else {
        pKVar3 = pNtk->pNodes[(long)Id - (ulong)uVar1];
        if (pKVar3 == (Kit_DsdObj_t *)0x0) {
          __assert_fail("Id < pNtk->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x147,"void Kit_DsdPrint_rec(FILE *, Kit_DsdNtk_t *, int)");
        }
        KVar2 = *pKVar3;
        uVar4 = (uint)KVar2 >> 6 & 7;
        if (uVar4 == 2) {
          if (((uint)KVar2 & 0xfc000000) != 0x4000000) {
            __assert_fail("pObj->nFans == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x154,"void Kit_DsdPrint_rec(FILE *, Kit_DsdNtk_t *, int)");
          }
        }
        else if (uVar4 == 1) {
          if ((uint)KVar2 < 0x4000000) {
            fwrite("Const1",6,1,(FILE *)pFile);
            return;
          }
          __assert_fail("pObj->nFans == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x14e,"void Kit_DsdPrint_rec(FILE *, Kit_DsdNtk_t *, int)");
        }
        iVar5 = 0x2a;
        if (uVar4 != 3) {
          iVar5 = (uVar4 != 4) + 0x2b;
        }
        if (((uint)KVar2 & 0x1c0) == 0x140) {
          Kit_DsdPrintHex(pFile,(uint *)((long)&pKVar3[1].field_0x0 +
                                        (ulong)((uint)KVar2 >> 8 & 0x3fc)),(uint)KVar2 >> 0x1a);
        }
        fputc(0x28,(FILE *)pFile);
        if (0x3ffffff < (uint)*pKVar3) {
          uVar6 = 0;
          do {
            uVar1 = *(ushort *)((long)&pKVar3[1].field_0x0 + uVar6 * 2);
            if ((uVar1 & 1) != 0) {
              fputc(0x21,(FILE *)pFile);
            }
            Kit_DsdPrint_rec(pFile,pNtk,(uint)(uVar1 >> 1));
            uVar4 = (uint)*pKVar3 >> 0x1a;
            if (uVar6 < uVar4 - 1) {
              fputc(iVar5,(FILE *)pFile);
              uVar4 = (uint)*pKVar3 >> 0x1a;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar4);
        }
        iVar5 = 0x29;
      }
      fputc(iVar5,(FILE *)pFile);
      return;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

void Kit_DsdPrint_rec( FILE * pFile, Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i;
    char Symbol;

    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        fprintf( pFile, "%c", 'a' + Id );
        return;
    }

    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        fprintf( pFile, "Const1" );
        return;
    }

    if ( pObj->Type == KIT_DSD_VAR )
        assert( pObj->nFans == 1 );

    if ( pObj->Type == KIT_DSD_AND )
        Symbol = '*';
    else if ( pObj->Type == KIT_DSD_XOR )
        Symbol = '+';
    else 
        Symbol = ',';

    if ( pObj->Type == KIT_DSD_PRIME )
        Kit_DsdPrintHex( pFile, Kit_DsdObjTruth(pObj), pObj->nFans );

    fprintf( pFile, "(" );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        if ( Abc_LitIsCompl(iLit) ) 
            fprintf( pFile, "!" );
        Kit_DsdPrint_rec( pFile, pNtk, Abc_Lit2Var(iLit) );
        if ( i < pObj->nFans - 1 )
            fprintf( pFile, "%c", Symbol );
    }
    fprintf( pFile, ")" );
}